

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::BasicCopyTexSubImageCubeCase::createTexture
          (BasicCopyTexSubImageCubeCase *this)

{
  ContextWrapper *this_00;
  uint uVar1;
  deUint32 format;
  deUint32 type;
  byte bVar2;
  int iVar3;
  uint uVar4;
  deUint32 dVar5;
  int height;
  int xoffset;
  int yoffset;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  Context *pCVar8;
  long lVar9;
  NotSupportedError *this_01;
  uint uVar10;
  int iVar11;
  ChannelOrder CVar12;
  bool bVar13;
  ulong uVar14;
  int iVar15;
  int local_250;
  deUint32 tex;
  ulong local_230;
  deUint32 local_224;
  TextureFormat fmt;
  Random rnd;
  TextureLevel data;
  Vec4 colorA;
  PixelBufferAccess local_1d0;
  Vector<float,_4> local_1a8;
  Vec4 colorB;
  GradientShader shader;
  
  iVar3 = (*((this->super_TextureSpecCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[4])();
  lVar9 = CONCAT44(extraout_var,iVar3);
  bVar13 = false;
  if ((0 < *(int *)(lVar9 + 8)) && (bVar13 = false, 0 < *(int *)(lVar9 + 0xc))) {
    bVar13 = 0 < *(int *)(lVar9 + 0x10);
  }
  fmt = (this->super_TextureSpecCase).m_texFormat;
  CVar12 = fmt.order;
  bVar2 = (byte)fmt.order;
  iVar3 = *(int *)(lVar9 + 0x14);
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_250 = 1;
  }
  else {
    uVar1 = (this->super_TextureSpecCase).m_width;
    uVar4 = 0x20;
    uVar10 = uVar4;
    if (uVar1 != 0) {
      uVar10 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar10 = uVar10 ^ 0x1f;
    }
    uVar1 = (this->super_TextureSpecCase).m_height;
    if (uVar1 != 0) {
      uVar4 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
    }
    local_250 = 0x1f - uVar4;
    if ((int)(0x1f - uVar4) < (int)(0x1f - uVar10)) {
      local_250 = 0x1f - uVar10;
    }
    local_250 = local_250 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar5 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar5);
  GradientShader::GradientShader(&shader);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_224 = (*pCVar8->_vptr_Context[0x75])(pCVar8,&shader);
  if ((CVar12 == A || bVar13) &&
     ((RGBA < CVar12 || (0xedU >> (bVar2 & 0x1f) & 1) != 0) || 0 < iVar3)) {
    sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
    for (iVar3 = 0; iVar3 != local_250; iVar3 = iVar3 + 1) {
      iVar15 = (this->super_TextureSpecCase).m_width >> ((byte)iVar3 & 0x1f);
      if (iVar15 < 2) {
        iVar15 = 1;
      }
      iVar11 = (this->super_TextureSpecCase).m_height >> ((byte)iVar3 & 0x1f);
      if (iVar11 < 2) {
        iVar11 = 1;
      }
      local_230 = CONCAT44(local_230._4_4_,iVar15);
      tcu::TextureLevel::setSize(&data,iVar15,iVar11,1);
      for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 4) {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_1d0,0.0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&colorB,1.0);
        randomVector<4>((Functional *)&colorA,(Random *)&rnd.m_rnd,(Vector<float,_4> *)&local_1d0,
                        (Vector<float,_4> *)&colorB);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_1d0,0.0);
        tcu::Vector<float,_4>::Vector(&local_1a8,1.0);
        randomVector<4>((Functional *)&colorB,(Random *)&rnd.m_rnd,(Vector<float,_4> *)&local_1d0,
                        &local_1a8);
        dVar5 = deRandom_getUint32(&rnd.m_rnd);
        tcu::TextureLevel::getAccess(&local_1d0,&data);
        tcu::fillWithGrid(&local_1d0,dVar5 % 0xf + 2,&colorA,&colorB);
        dVar5 = *(deUint32 *)((long)&s_cubeMapFaces + lVar9);
        format = this->m_format;
        type = this->m_dataType;
        tcu::TextureLevel::getAccess(&local_1d0,&data);
        sglr::ContextWrapper::glTexImage2D
                  (this_00,dVar5,iVar3,format,(int)local_230,iVar11,0,format,type,
                   local_1d0.super_ConstPixelBufferAccess.m_data);
      }
    }
    pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_1d0.super_ConstPixelBufferAccess.m_format.order = 0xbf800000;
    local_1d0.super_ConstPixelBufferAccess.m_format.type = 0xbf800000;
    local_1d0.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    colorA.m_data[0] = 1.0;
    colorA.m_data[1] = 1.0;
    colorA.m_data[2] = 0.0;
    sglr::drawQuad(pCVar8,local_224,(Vec3 *)&local_1d0,(Vec3 *)&colorA);
    uVar14 = 0;
    while ((int)uVar14 != local_250) {
      iVar3 = (this->super_TextureSpecCase).m_width >> ((byte)uVar14 & 0x1f);
      if (iVar3 < 2) {
        iVar3 = 1;
      }
      iVar15 = (this->super_TextureSpecCase).m_height >> ((byte)uVar14 & 0x1f);
      if (iVar15 < 2) {
        iVar15 = 1;
      }
      local_230 = uVar14;
      for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 4) {
        iVar11 = de::Random::getInt(&rnd,1,iVar3);
        height = de::Random::getInt(&rnd,1,iVar15);
        xoffset = de::Random::getInt(&rnd,0,iVar3 - iVar11);
        yoffset = de::Random::getInt(&rnd,0,iVar15 - height);
        iVar6 = sglr::ContextWrapper::getWidth(this_00);
        iVar6 = de::Random::getInt(&rnd,0,iVar6 - iVar11);
        iVar7 = sglr::ContextWrapper::getHeight(this_00);
        iVar7 = de::Random::getInt(&rnd,0,iVar7 - height);
        sglr::ContextWrapper::glCopyTexSubImage2D
                  (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar9),(int)local_230,xoffset,
                   yoffset,iVar6,iVar7,iVar11,height);
      }
      uVar14 = (ulong)((int)local_230 + 1);
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    tcu::TextureLevel::~TextureLevel(&data);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Copying from current framebuffer is not supported",
             glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
             ,0x5c0);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= m_texFormat;
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		int							numLevels		= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32					tex				= 0;
		tcu::TextureLevel			data			(fmt);
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader;
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			data.setSize(levelW, levelH);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4	colorA		= randomVector<4>(rnd);
				Vec4	colorB		= randomVector<4>(rnd);
				int		cellSize	= rnd.getInt(2, 16);

				tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);
				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}

		// Fill render target with gradient.
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		// Re-specify parts of each face and level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				int		w			= rnd.getInt(1, levelW);
				int		h			= rnd.getInt(1, levelH);
				int		xo			= rnd.getInt(0, levelW-w);
				int		yo			= rnd.getInt(0, levelH-h);

				int		x			= rnd.getInt(0, getWidth() - w);
				int		y			= rnd.getInt(0, getHeight() - h);

				glCopyTexSubImage2D(s_cubeMapFaces[face], ndx, xo, yo, x, y, w, h);
			}
		}
	}